

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_InitClassMember(Var obj,PropertyId propertyId,Var newValue)

{
  RecyclableObject *pRVar1;
  
  pRVar1 = VarTo<Js::RecyclableObject>(obj);
  (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x1e])(pRVar1,(ulong)(uint)propertyId,newValue,6,0,0,0xf);
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_InitClassMember(Var obj, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_InitClassMember);
        RecyclableObject* instance = VarTo<RecyclableObject>(obj);

        PropertyOperationFlags flags = PropertyOperation_None;
        PropertyAttributes attributes = PropertyClassMemberDefaults;

        instance->SetPropertyWithAttributes(propertyId, newValue, attributes, NULL, flags);

        return TRUE;
        JIT_HELPER_END(Op_InitClassMember);
    }